

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

int fwd_aa_tab_clear(jit_State *J,IRRef lim,IRRef ta)

{
  IRIns *pIVar1;
  AliasRet AVar2;
  IRRef1 *pIVar3;
  
  pIVar3 = J->chain + 0x62;
  do {
    if (*pIVar3 <= lim) {
      return 1;
    }
    pIVar1 = (J->cur).ir + *pIVar3;
    if ((pIVar1->field_0).op2 == 0x22) {
      if ((pIVar1->field_0).op1 == ta) {
        return 0;
      }
      AVar2 = aa_table(J,ta,(uint)(pIVar1->field_0).op1);
      if (AVar2 != ALIAS_NO) {
        return 0;
      }
    }
    pIVar3 = &(pIVar1->field_0).prev;
  } while( true );
}

Assistant:

static int fwd_aa_tab_clear(jit_State *J, IRRef lim, IRRef ta)
{
  IRRef ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *calls = IR(ref);
    if (calls->op2 == IRCALL_lj_tab_clear &&
	(ta == calls->op1 || aa_table(J, ta, calls->op1) != ALIAS_NO))
      return 0;  /* Conflict. */
    ref = calls->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}